

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zealot.c
# Opt level: O0

void burning_vision_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  AFFECT_DATA *caf;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  AFFECT_DATA *pAVar4;
  
  iVar2 = get_bv_stage(in_stack_ffffffffffffffe8);
  if ((3 < iVar2) && (bVar1 = is_affected_by(in_RDI,(int)((ulong)in_RSI >> 0x20)), !bVar1)) {
    act((char *)caf,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    act((char *)caf,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    for (pAVar4 = in_RDI->affected;
        (pAVar4 != (AFFECT_DATA *)0x0 && (pAVar4->type != gsn_burning_vision));
        pAVar4 = pAVar4->next) {
    }
    _Var3 = std::pow<int,int>(0,0x763588);
    pAVar4->bitvector[0] = (long)_Var3 | pAVar4->bitvector[0];
    _Var3 = std::pow<int,int>(0,0x7635a5);
    in_RDI->affected_by[0] = (long)_Var3 | in_RDI->affected_by[0];
  }
  return;
}

Assistant:

void burning_vision_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	AFFECT_DATA *caf;

	if (get_bv_stage(ch) >= 4 && !is_affected_by(ch, AFF_BLIND))
	{
		act("You are blinded!", ch, 0, 0, TO_CHAR);
		act("$n appears to be blinded.", ch, 0, 0, TO_ROOM);

		for (caf = ch->affected; caf != nullptr; caf = caf->next)
		{
			if (caf->type == gsn_burning_vision)
				break;
		}

		SET_BIT(caf->bitvector, AFF_BLIND);
		SET_BIT(ch->affected_by, AFF_BLIND);
	}
}